

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntfs-part.c
# Opt level: O0

ntfs_part * ntfs_open_part(hd_context *ctx,hd_disk *disk,char *partname)

{
  int *piVar1;
  int iVar2;
  ntfs_part *pnStack_28;
  int dev_fd;
  ntfs_part *part;
  char *partname_local;
  hd_disk *disk_local;
  hd_context *ctx_local;
  
  pnStack_28 = (ntfs_part *)0x0;
  part = (ntfs_part *)partname;
  partname_local = (char *)disk;
  disk_local = (hd_disk *)ctx;
  hd_var_imp(&stack0xffffffffffffffd8);
  iVar2 = hd_push_try((hd_context *)disk_local);
  if ((iVar2 != 0) && (iVar2 = __sigsetjmp(**(long **)&disk_local->sector_size + 8,0), iVar2 == 0))
  {
    iVar2 = hd_open_dev((hd_context *)disk_local,(char *)part);
    pnStack_28 = ntfs_new_part((hd_context *)disk_local,iVar2);
    hd_read_write_device
              ((hd_context *)disk_local,(pnStack_28->super).dev_fd,false,
               (pnStack_28->super).scan_buffer,0,(ulong)(uint)(*(int *)(partname_local + 8) << 3));
  }
  piVar1 = (int *)**(undefined8 **)&disk_local->sector_size;
  **(undefined8 **)&disk_local->sector_size = piVar1 + -0x34;
  if (*piVar1 < 2) {
    return pnStack_28;
  }
  hd_drop_part((hd_context *)disk_local,&pnStack_28->super);
  hd_rethrow((hd_context *)disk_local);
}

Assistant:

ntfs_part *
ntfs_open_part (hd_context *ctx, hd_disk *disk, const char *partname)
{
    ntfs_part *part = NULL;

    int dev_fd;
    hd_var(part);

    hd_try(ctx)
    {
        dev_fd = hd_open_dev(ctx, partname);
        part = ntfs_new_part(ctx, dev_fd);
        hd_read_write_device(ctx, part->super.dev_fd, false, part->super.scan_buffer, 0, 8 * disk->sector_size);

    }
    hd_catch(ctx)
    {
        hd_drop_part(ctx, &part->super);
        hd_rethrow(ctx);
    }
    return part;
}